

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Line.cpp
# Opt level: O3

void __thiscall Line::filter(Line *this,Known *known)

{
  vector<bool,_std::allocator<bool>_> *pvVar1;
  bool bVar2;
  long lVar3;
  vector<bool,_std::allocator<bool>_> *pvVar4;
  __normal_iterator<std::vector<bool,_std::allocator<bool>_>_*,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
  __it;
  __normal_iterator<std::vector<bool,_std::allocator<bool>_>_*,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
  _Var5;
  __normal_iterator<std::vector<bool,_std::allocator<bool>_>_*,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
  __first;
  long lVar6;
  long lVar7;
  
  pvVar4 = (this->m_options).
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->m_options).
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)pvVar1 - (long)pvVar4;
  lVar6 = (lVar7 >> 3) * -0x3333333333333333;
  if ((int)lVar6 == 1) {
    return;
  }
  lVar6 = lVar6 >> 2;
  lVar3 = lVar7;
  _Var5._M_current = pvVar4;
  if (0 < lVar6) {
    _Var5._M_current = pvVar4 + lVar6 * 4;
    lVar6 = lVar6 + 1;
    __it._M_current = pvVar4;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<Line::filter(std::pair<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>const&)::$_0>
              ::operator()((_Iter_pred<Line::filter(std::pair<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>const&)::__0>
                            *)known,__it);
      __first._M_current = __it._M_current;
      if (bVar2) goto LAB_0010626f;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<Line::filter(std::pair<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>const&)::$_0>
              ::operator()((_Iter_pred<Line::filter(std::pair<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>const&)::__0>
                            *)known,__it._M_current + 1);
      __first._M_current = __it._M_current + 1;
      if (bVar2) goto LAB_0010626f;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<Line::filter(std::pair<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>const&)::$_0>
              ::operator()((_Iter_pred<Line::filter(std::pair<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>const&)::__0>
                            *)known,__it._M_current + 2);
      __first._M_current = __it._M_current + 2;
      if (bVar2) goto LAB_0010626f;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<Line::filter(std::pair<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>const&)::$_0>
              ::operator()((_Iter_pred<Line::filter(std::pair<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>const&)::__0>
                            *)known,__it._M_current + 3);
      __first._M_current = __it._M_current + 3;
      if (bVar2) goto LAB_0010626f;
      __it._M_current = __it._M_current + 4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
    lVar3 = (long)pvVar1 - (long)_Var5._M_current;
  }
  lVar6 = (lVar3 >> 3) * -0x3333333333333333;
  if (lVar6 == 1) {
LAB_00106259:
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Line::filter(std::pair<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>const&)::$_0>
            ::operator()((_Iter_pred<Line::filter(std::pair<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>const&)::__0>
                          *)known,_Var5);
    __first._M_current = _Var5._M_current;
    if (!bVar2) {
      __first._M_current = pvVar1;
    }
  }
  else if (lVar6 == 2) {
LAB_00106246:
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Line::filter(std::pair<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>const&)::$_0>
            ::operator()((_Iter_pred<Line::filter(std::pair<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>const&)::__0>
                          *)known,_Var5);
    __first._M_current = _Var5._M_current;
    if (!bVar2) {
      _Var5._M_current = _Var5._M_current + 1;
      goto LAB_00106259;
    }
  }
  else {
    __first._M_current = pvVar1;
    if (lVar6 != 3) goto LAB_001062c9;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Line::filter(std::pair<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>const&)::$_0>
            ::operator()((_Iter_pred<Line::filter(std::pair<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>const&)::__0>
                          *)known,_Var5);
    __first._M_current = _Var5._M_current;
    if (!bVar2) {
      _Var5._M_current = _Var5._M_current + 1;
      goto LAB_00106246;
    }
  }
LAB_0010626f:
  _Var5._M_current = __first._M_current + 1;
  if (_Var5._M_current != pvVar1 && __first._M_current != pvVar1) {
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<Line::filter(std::pair<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>const&)::$_0>
              ::operator()((_Iter_pred<Line::filter(std::pair<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>const&)::__0>
                            *)known,_Var5);
      if (!bVar2) {
        std::vector<bool,_std::allocator<bool>_>::operator=(__first._M_current,_Var5._M_current);
        __first._M_current = __first._M_current + 1;
      }
      _Var5._M_current = _Var5._M_current + 1;
    } while (_Var5._M_current != pvVar1);
    pvVar4 = (this->m_options).
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar7 = (long)(this->m_options).
                  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4;
  }
LAB_001062c9:
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::_M_erase(&this->m_options,(iterator)__first._M_current,
             (vector<bool,_std::allocator<bool>_> *)
             ((long)&(pvVar4->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar7));
  return;
}

Assistant:

void Line::filter(const Known &known) {
    int previous_size = m_options.size();

    if (previous_size == 1) {
        return;
    }

#if DEBUG_TRACES
    Logger logger(TRACE);
    auto &output = logger.get();
    output << "KNOWN:  ";
    for (int i = 0; i < known.first.size(); i++) {
        output << (known.first[i] ? (known.second[i] ? '1' : '0') : ' ');
    }
    output << endl;
    logger.flush();
#endif //DEBUG_TRACES

    m_options.erase(remove_if(m_options.begin(), m_options.end(), [&known](const vector<bool> &option) {
        return !check_option(known, option);
    }), m_options.end());

#if DEBUG_LOGS
    Logger(DEBUG).get() << "Filter options " << previous_size << " -> " << m_options.size() << endl;
#endif // DEBUG_LOGS
}